

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpproxy.cpp
# Opt level: O1

void __thiscall httpproxy::~httpproxy(httpproxy *this)

{
  epoll_event *peVar1;
  naiveconfig *pnVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  
  (this->super_tcpproxy).super_proxy._vptr_proxy = (_func_int **)&PTR__httpproxy_00109ca8;
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->clientfds)._M_h);
  peVar1 = (this->super_tcpproxy).events;
  if (peVar1 != (epoll_event *)0x0) {
    operator_delete__(peVar1);
    (this->super_tcpproxy).events = (epoll_event *)0x0;
  }
  pnVar2 = (this->super_tcpproxy).super_proxy.cfg;
  if (pnVar2 != (naiveconfig *)0x0) {
    lVar5 = *(long *)((long)&pnVar2[-1].hostname.field_2 + 8);
    if (lVar5 != 0) {
      paVar4 = &pnVar2[lVar5 + -1].hostname.field_2;
      lVar5 = lVar5 * -0x38;
      do {
        pcVar3 = (((string *)(paVar4 + -1))->_M_dataplus)._M_p;
        if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar3) {
          operator_delete(pcVar3);
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar4 + -0x38);
        lVar5 = lVar5 + 0x38;
      } while (lVar5 != 0);
    }
    operator_delete__((void *)((long)&pnVar2[-1].hostname.field_2 + 8));
    (this->super_tcpproxy).super_proxy.cfg = (naiveconfig *)0x0;
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->clientfds)._M_h);
  tcpproxy::~tcpproxy(&this->super_tcpproxy);
  return;
}

Assistant:

httpproxy::~httpproxy()
{
    clientfds.clear();
    if (events)
    {
        delete[] events;
        events = NULL;
    }
    if (cfg)
    {
        delete[] cfg;
        cfg = NULL;
    }
}